

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colibri.c
# Opt level: O0

Col_Char1 * Col_Utf8Set(Col_Char1 *data,Col_Char c)

{
  byte bVar1;
  Col_Char1 *pCStack_10;
  Col_Char c_local;
  Col_Char1 *data_local;
  
  bVar1 = (byte)c;
  if (c < 0x80) {
    pCStack_10 = data + 1;
    *data = bVar1;
  }
  else if (c < 0x800) {
    *data = (byte)(c >> 6) & 0x1f | 0xc0;
    pCStack_10 = data + 2;
    data[1] = bVar1 & 0x3f | 0x80;
  }
  else if ((c < 0xd800) || ((0xdfff < c && (c < 0x10000)))) {
    *data = (byte)(c >> 0xc) & 0x1f | 0xe0;
    data[1] = (byte)(c >> 6) & 0x3f | 0x80;
    pCStack_10 = data + 3;
    data[2] = bVar1 & 0x3f | 0x80;
  }
  else {
    pCStack_10 = data;
    if ((0xffff < c) && (c < 0x110000)) {
      *data = (byte)(c >> 0x12) & 0x1f | 0xf0;
      data[1] = (byte)(c >> 0xc) & 0x3f | 0x80;
      data[2] = (byte)(c >> 6) & 0x3f | 0x80;
      pCStack_10 = data + 4;
      data[3] = bVar1 & 0x3f | 0x80;
    }
  }
  return pCStack_10;
}

Assistant:

Col_Char1 *
Col_Utf8Set(
    Col_Char1 * data,   /*!< UTF-8 code unit sequence. */
    Col_Char c)         /*!< Character to write. */
{
    if (c <= 0x7F) {
        *data++ = (Col_Char1) c;
    } else if (c <= 0x7FF) {
        *data++ = (Col_Char1) (((c>>6)&0x1F)|0xC0);
        *data++ = (Col_Char1) (( c    &0x3F)|0x80);
    } else if (c <= 0xD7FF || (c >= 0xE000 && c <= 0xFFFF)) {
        *data++ = (Col_Char1) (((c>>12)&0x1F)|0xE0);
        *data++ = (Col_Char1) (((c>> 6)&0x3F)|0x80);
        *data++ = (Col_Char1) (( c     &0x3F)|0x80);
    } else if (c >= 0x10000 && c <= 0x10FFFF) {
        *data++ = (Col_Char1) (((c>>18)&0x1F)|0xF0);
        *data++ = (Col_Char1) (((c>>12)&0x3F)|0x80);
        *data++ = (Col_Char1) (((c>> 6)&0x3F)|0x80);
        *data++ = (Col_Char1) (( c     &0x3F)|0x80);
    }

    return data;
}